

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

void __thiscall
MPL::detail::ModelPackageImpl::ModelPackageImpl
          (ModelPackageImpl *this,path *path,bool createIfNecessary,bool readOnly)

{
  path *__return_storage_ptr__;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *this_00;
  pointer pcVar1;
  char cVar2;
  JsonMap *pJVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  pointer __p;
  stringstream ss;
  string local_278;
  string local_258;
  undefined1 local_238 [128];
  ios_base local_1b8 [392];
  
  std::filesystem::__cxx11::path::path(&this->m_packagePath,path);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_238,&kModelPackageManifestFileName,auto_format);
  __return_storage_ptr__ = &this->m_manifestPath;
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,path,(path *)local_238);
  std::filesystem::__cxx11::path::~path((path *)local_238);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_238,&kModelPackageDataDir,auto_format);
  std::filesystem::__cxx11::operator/(&this->m_packageDataDirPath,path,(path *)local_238);
  std::filesystem::__cxx11::path::~path((path *)local_238);
  this_00 = &this->m_manifest;
  (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl = (JsonMap *)0x0;
  this->m_readOnly = readOnly;
  cVar2 = std::filesystem::status(&this->m_packagePath);
  if ((cVar2 == '\0') || (cVar2 == -1)) {
    if (!createIfNecessary) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar1 = (this->m_packagePath)._M_pathname._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,pcVar1,
                 pcVar1 + (this->m_packagePath)._M_pathname._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "Failed to open model package at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)local_238);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar2 = std::filesystem::create_directory(&this->m_packagePath);
    if (cVar2 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar1 = (this->m_packagePath)._M_pathname._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,pcVar1,
                 pcVar1 + (this->m_packagePath)._M_pathname._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "Failed to create model package at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)local_238);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar2 = std::filesystem::create_directory(&this->m_packageDataDirPath);
    if (cVar2 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar1 = (this->m_packageDataDirPath)._M_pathname._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,pcVar1,
                 pcVar1 + (this->m_packageDataDirPath)._M_pathname._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "Failed to create data directory at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)local_238);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pJVar3 = (JsonMap *)operator_new(8);
    JsonMap::JsonMap(pJVar3);
    local_238._0_8_ = (pointer)0x0;
    std::__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>::reset
              ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_> *)this_00,pJVar3);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_238);
    std::__cxx11::stringstream::stringstream((stringstream *)local_238);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)(local_238 + 0x10),1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    std::ostream::operator<<((ostream *)poVar4,0);
    pJVar3 = (this_00->_M_t).super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
             super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"fileFormatVersion","");
    std::__cxx11::stringbuf::str();
    JsonMap::setString(pJVar3,&local_278,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
    std::ios_base::~ios_base(local_1b8);
  }
  else {
    cVar2 = std::filesystem::status(__return_storage_ptr__);
    if ((cVar2 == '\0') || (cVar2 == -1)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar1 = (this->m_manifestPath)._M_pathname._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,pcVar1,
                 pcVar1 + (this->m_manifestPath)._M_pathname._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "A valid manifest does not exist at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)local_238);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::ifstream(local_238,(__return_storage_ptr__->_M_pathname)._M_dataplus._M_p,_S_bin)
    ;
    pJVar3 = (JsonMap *)operator_new(8);
    JsonMap::JsonMap(pJVar3,(istream *)local_238);
    local_278._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>::reset
              ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_> *)this_00,pJVar3);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)&local_278);
    std::ifstream::close();
    std::ifstream::~ifstream(local_238);
  }
  validate(this);
  return;
}

Assistant:

ModelPackageImpl::ModelPackageImpl(const std::filesystem::path& path, bool createIfNecessary, bool readOnly)
: m_packagePath(path),
  m_manifestPath(path / kModelPackageManifestFileName),
  m_packageDataDirPath(path / kModelPackageDataDir),
  m_manifest(nullptr),
  m_readOnly(readOnly)
{
    if (std::filesystem::exists(m_packagePath)) {
        if (std::filesystem::exists(m_manifestPath)) {
            std::ifstream manifestStream(m_manifestPath, std::ios::binary);
            m_manifest = std::make_unique<JsonMap>(manifestStream);
            manifestStream.close();
        } else {
            throw std::runtime_error("A valid manifest does not exist at path: " + m_manifestPath.string());
        }
    }
    // Create the package structure at specified path
    else if (createIfNecessary) {
        if (false == create_directory(m_packagePath)) {
            throw std::runtime_error("Failed to create model package at path: " + m_packagePath.string());
        }
        
        if (false == create_directory(m_packageDataDirPath)) {
            throw std::runtime_error("Failed to create data directory at path: " + m_packageDataDirPath.string());
        }
        
        m_manifest = std::make_unique<JsonMap>();
        std::stringstream ss;
        ss << kModelPackageFileFormatMajorVersion << "." << kModelPackageFileFormatMinorVersion << "." << kModelPackageFileFormatPatchVersion;
        m_manifest->setString(kModelPackageFileFormatVersionKey, ss.str());
    }
    // Error out since package does not exist
    else {
        throw std::runtime_error("Failed to open model package at path: " + m_packagePath.string());
    }
    
    validate();
}